

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i16 sqlite3TableColumnToStorage(Table *pTab,i16 iCol)

{
  ulong uVar1;
  i16 iVar2;
  undefined6 in_register_00000032;
  long lVar3;
  
  iVar2 = iCol;
  if ((-1 < iCol) && ((pTab->tabFlags & 0x20) != 0)) {
    uVar1 = CONCAT62(in_register_00000032,iCol) & 0xffffffff;
    if (iCol == 0) {
      iVar2 = 0;
    }
    else {
      lVar3 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + (ushort)((*(byte *)((long)&pTab->aCol->colFlags + lVar3) & 0x20) == 0);
        lVar3 = lVar3 + 0x10;
      } while (uVar1 << 4 != lVar3);
    }
    if ((pTab->aCol[uVar1].colFlags & 0x20) != 0) {
      return (iCol - iVar2) + pTab->nNVCol;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE i16 sqlite3TableColumnToStorage(Table *pTab, i16 iCol){
  int i;
  i16 n;
  assert( iCol<pTab->nCol );
  if( (pTab->tabFlags & TF_HasVirtual)==0 || iCol<0 ) return iCol;
  for(i=0, n=0; i<iCol; i++){
    if( (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) n++;
  }
  if( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL ){
    /* iCol is a virtual column itself */
    return pTab->nNVCol + i - n;
  }else{
    /* iCol is a normal or stored column */
    return n;
  }
}